

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darLib.c
# Opt level: O3

void Dar_LibReturnCanonicals(uint *pCanons)

{
  uchar *puVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  int Visits [222];
  int aiStack_388 [222];
  
  uVar5 = 0;
  memset(aiStack_388,0,0x378);
  puVar1 = s_DarLib->pMap;
  lVar3 = 0;
  iVar2 = 0;
  do {
    if (aiStack_388[puVar1[lVar3]] == 0) {
      aiStack_388[puVar1[lVar3]] = 1;
      lVar4 = (long)iVar2;
      iVar2 = iVar2 + 1;
      pCanons[lVar4] = uVar5;
    }
    lVar3 = lVar3 + 1;
    uVar5 = uVar5 + 0x10001;
  } while (lVar3 != 0x10000);
  if (iVar2 == 0xde) {
    return;
  }
  __assert_fail("k == 222",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darLib.c"
                ,0xde,"void Dar_LibReturnCanonicals(unsigned int *)");
}

Assistant:

void Dar_LibReturnCanonicals( unsigned * pCanons )
{
    int Visits[222] = {0};
    int i, k;
    // find canonical truth tables
    for ( i = k = 0; i < (1<<16); i++ )
        if ( !Visits[s_DarLib->pMap[i]] )
        {
            Visits[s_DarLib->pMap[i]] = 1;
            pCanons[k++] = ((i<<16) | i);
        }
    assert( k == 222 );
}